

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionDoesNotResetOnLogon::RunImpl
          (TestsessionFixtureSessionDoesNotResetOnLogon *this)

{
  TestDetails *details;
  sessionFixtureSessionDoesNotResetOnLogonHelper fixtureHelper;
  sessionFixtureSessionDoesNotResetOnLogonHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixtureSessionDoesNotResetOnLogonHelper::sessionFixtureSessionDoesNotResetOnLogonHelper
            (&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionDoesNotResetOnLogonHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture(&local_660.super_sessionFixture);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionDoesNotResetOnLogon) {
  createSession(1);
  object->setResetOnLogon(false);
  CHECK(!object->getResetOnLogon());
}